

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTipPartials
          (BeagleCPUImpl<float,_1,_0> *this,int tipIndex,double *inPartials)

{
  int iVar1;
  int iVar2;
  int k;
  int iVar3;
  float *pfVar4;
  uint uVar5;
  int i;
  int iVar6;
  double *from;
  int l;
  int iVar7;
  bool bVar8;
  
  iVar7 = -5;
  if ((-1 < tipIndex) && (iVar7 = -5, tipIndex < this->kTipCount)) {
    pfVar4 = this->gPartials[(uint)tipIndex];
    if (pfVar4 == (float *)0x0) {
      pfVar4 = (float *)mallocAligned(this,(long)this->kPartialsSize << 2);
      this->gPartials[(uint)tipIndex] = pfVar4;
      pfVar4 = this->gPartials[(uint)tipIndex];
      if (pfVar4 == (float *)0x0) {
        return -2;
      }
    }
    for (iVar7 = 0; iVar7 < this->kCategoryCount; iVar7 = iVar7 + 1) {
      from = inPartials;
      for (iVar6 = 0; iVar6 < this->kPatternCount; iVar6 = iVar6 + 1) {
        beagleMemCpy<float,double_const>(pfVar4,from,this->kStateCount);
        iVar1 = this->kStateCount;
        iVar2 = this->kPartialsPaddedStateCount;
        pfVar4 = pfVar4 + iVar1;
        for (iVar3 = iVar1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          *pfVar4 = 0.0;
          pfVar4 = pfVar4 + 1;
        }
        from = from + iVar1;
      }
      uVar5 = (this->kPaddedPatternCount - this->kPatternCount) * this->kPartialsPaddedStateCount;
      uVar5 = ~((int)uVar5 >> 0x1f) & uVar5;
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        *pfVar4 = 0.0;
        pfVar4 = pfVar4 + 1;
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}